

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O3

TestCaseGroup * vkt::pipeline::createVertexInputTests(TestContext *testCtx)

{
  long lVar1;
  VkFormat VVar2;
  iterator __position;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  deUint32 dVar6;
  value_type *__val;
  TestNode *this;
  TestNode *pTVar7;
  VertexInputTest *pVVar8;
  pointer pAVar9;
  long lVar10;
  TestNode *pTVar11;
  TestNode *this_00;
  TestNode *this_01;
  ostream *poVar12;
  TestNode *this_02;
  ulong uVar13;
  AttributeInfo *attributeInfo_00;
  AttributeInfo *attributeInfo_01;
  AttributeInfo *attributeInfo_02;
  AttributeInfo *attributeInfo_03;
  VkFormat *__args;
  allocator_type *__a;
  AttributeInfo *extraout_RDX;
  AttributeInfo *extraout_RDX_00;
  AttributeInfo *extraout_RDX_01;
  AttributeInfo *extraout_RDX_02;
  AttributeInfo *attributeInfo_04;
  AttributeInfo *attributeInfo_05;
  int glslTypeNdx;
  GlslType glslType;
  uint uVar14;
  VkVertexInputRate *pVVar15;
  ulong uVar16;
  long lVar17;
  pointer pAVar18;
  AttributeInfo attributeInfo;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  glslTypes;
  string caseName;
  Random randomFunc;
  VkFormat vertexFormats [40];
  ostringstream caseName_1;
  CompatibleFormats compatibleFormats [22];
  string local_600;
  GlslTypeCombinationsIterator local_5e0;
  _Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
  local_598;
  void *local_580;
  void *local_578;
  long local_570;
  string *local_568;
  string local_558;
  string local_538;
  vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
  local_518 [7];
  undefined1 local_470 [112];
  ios_base local_400 [240];
  long alStack_310 [3];
  undefined1 local_2f8 [8];
  long lStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8 [43];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,testCtx,"vertex_input","");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,testCtx,"single_attribute","Uses one attribute");
  lVar10 = 0;
  do {
    VVar2 = (&DAT_00adbcd0)[lVar10];
    glslType = GLSL_TYPE_INT;
    do {
      bVar5 = anon_unknown_0::VertexInputTest::isCompatibleType(VVar2,glslType);
      if (bVar5) {
        local_5e0.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        ._vptr_CombinationsIterator = (_func_int **)CONCAT44(VVar2,glslType);
        local_5e0.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        .m_numItems = VK_VERTEX_INPUT_RATE_VERTEX;
        pVVar8 = (VertexInputTest *)operator_new(0x98);
        (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                  ((string *)local_2f8,(_anonymous_namespace_ *)&local_5e0,attributeInfo_00);
        (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                  ((string *)local_470,(_anonymous_namespace_ *)&local_5e0,attributeInfo_01);
        pAVar9 = (pointer)operator_new(0xc);
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pAVar9 + 1;
        pAVar9->inputRate =
             local_5e0.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             .m_numItems;
        *(_func_int ***)pAVar9 =
             local_5e0.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             ._vptr_CombinationsIterator;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pAVar9;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_518[0].
             super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        anon_unknown_0::VertexInputTest::VertexInputTest
                  (pVVar8,testCtx,(string *)local_2f8,(string *)local_470._0_8_,local_518,
                   BINDING_MAPPING_ONE_TO_ONE,ATTRIBUTE_LAYOUT_INTERLEAVED);
        tcu::TestNode::addChild(pTVar7,(TestNode *)pVVar8);
        operator_delete(pAVar9,0xc);
        if ((string *)local_470._0_8_ != (string *)(local_470 + 0x10)) {
          operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
        }
        if (local_2f8 != (undefined1  [8])local_2e8) {
          operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
        }
        local_5e0.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        .m_numItems = VK_VERTEX_INPUT_RATE_INSTANCE;
        pVVar8 = (VertexInputTest *)operator_new(0x98);
        (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                  ((string *)local_2f8,(_anonymous_namespace_ *)&local_5e0,attributeInfo_02);
        (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                  ((string *)local_470,(_anonymous_namespace_ *)&local_5e0,attributeInfo_03);
        pAVar9 = (pointer)operator_new(0xc);
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pAVar9 + 1;
        pAVar9->inputRate =
             local_5e0.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             .m_numItems;
        *(_func_int ***)pAVar9 =
             local_5e0.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             ._vptr_CombinationsIterator;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pAVar9;
        local_518[0].
        super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_518[0].
             super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        anon_unknown_0::VertexInputTest::VertexInputTest
                  (pVVar8,testCtx,(string *)local_2f8,(string *)local_470._0_8_,local_518,
                   BINDING_MAPPING_ONE_TO_ONE,ATTRIBUTE_LAYOUT_INTERLEAVED);
        tcu::TestNode::addChild(pTVar7,(TestNode *)pVVar8);
        operator_delete(pAVar9,0xc);
        if ((string *)local_470._0_8_ != (string *)(local_470 + 0x10)) {
          operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
        }
        if (local_2f8 != (undefined1  [8])local_2e8) {
          operator_delete((void *)local_2f8,local_2e8[0]._M_allocated_capacity + 1);
        }
      }
      glslType = glslType + GLSL_TYPE_IVEC2;
    } while (glslType != GLSL_TYPE_COUNT);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x44);
  tcu::TestNode::addChild(this,pTVar7);
  memcpy(local_518,&DAT_00adbe50,0xa0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,testCtx,"multiple_attributes","Uses more than one attribute");
  lVar10 = 8;
  do {
    *(undefined8 *)(local_2f8 + lVar10) = 0;
    *(undefined8 *)((long)&lStack_2f0 + lVar10) = 0;
    *(undefined8 *)((long)local_2e8 + lVar10) = 0;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x2c8);
  lVar10 = 0;
  do {
    lVar17 = 0;
    do {
      bVar5 = anon_unknown_0::VertexInputTest::isCompatibleType
                        (*(VkFormat *)
                          ((long)&local_518[0].
                                  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar17),
                         (GlslType)lVar10);
      if (bVar5) {
        __args = (VkFormat *)
                 ((long)&local_518[0].
                         super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar17);
        __position._M_current = *(VkFormat **)(local_2e8 + lVar10 * 2);
        if (__position._M_current == *(VkFormat **)((long)local_2e8 + lVar10 * 0x20 + 8)) {
          std::vector<vk::VkFormat,std::allocator<vk::VkFormat>>::
          _M_realloc_insert<vk::VkFormat_const&>
                    ((vector<vk::VkFormat,std::allocator<vk::VkFormat>> *)(&lStack_2f0 + lVar10 * 4)
                     ,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          local_2e8[lVar10 * 2]._M_allocated_capacity = (size_type)(__position._M_current + 1);
        }
      }
      lVar17 = lVar17 + 4;
    } while (lVar17 != 0xa0);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x16);
  deRandom_init((deRandom *)&local_538.field_2,0x18e8e);
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  ._vptr_CombinationsIterator = (_func_int **)&PTR__CombinationsIterator_00d26a80;
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_numItems = 0xf;
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationSize = 3;
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationCount = 0x1c7;
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_5e0.
              super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
              .m_combination,3);
  if (local_5e0.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationSize != 0) {
    uVar13 = 0;
    do {
      local_5e0.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] = (uint)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (local_5e0.
                       super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                       ._16_8_ & 0xffffffff));
  }
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  .m_combinationIndex = 0;
  local_5e0.
  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
  ._vptr_CombinationsIterator = (_func_int **)&PTR__GlslTypeCombinationsIterator_00d26a30;
  local_5e0.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e0.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e0.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5e0.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xc);
  local_5e0.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_5e0.m_combinationValue.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
       ._M_impl.super__Vector_impl_data._M_start + 3;
  *local_5e0.m_combinationValue.
   super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
   ._M_impl.super__Vector_impl_data._M_start = GLSL_TYPE_INT;
  local_5e0.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = GLSL_TYPE_INT;
  local_5e0.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_start[2] = GLSL_TYPE_INT;
  local_5e0.m_combinationValue.
  super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_5e0.m_combinationValue.
       super__Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar11,testCtx,"attributes","");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,testCtx,"attributes","");
  this_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_01,testCtx,"attributes_sequential","");
  if (local_5e0.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationIndex <
      local_5e0.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationCount) {
    do {
      if (local_5e0.
          super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
          .m_combinationIndex != 0) {
        uVar13 = local_5e0.
                 super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                 ._16_8_ & 0xffffffff;
        if (-1 < (int)(local_5e0.
                       super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                       .m_combinationSize - 1)) {
          uVar16 = (ulong)(local_5e0.
                           super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                           .m_combinationSize - 1);
          lVar17 = uVar13 << 0x20;
          lVar10 = 0;
          do {
            uVar14 = local_5e0.
                     super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                     .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar16 + lVar10] + 1;
            if (uVar14 < local_5e0.
                         super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                         .m_numItems) {
              dVar6 = local_5e0.
                      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                      .m_combinationSize;
              if ((int)lVar10 != 0) {
                if (*(uint *)((long)local_5e0.
                                    super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                                    .m_combination.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + (lVar17 >> 0x1e)) <=
                    uVar14) goto LAB_0048b812;
                dVar6 = (deUint32)uVar13;
              }
              local_5e0.
              super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
              .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[uVar16 + lVar10] = uVar14;
              if (dVar6 < local_5e0.
                          super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                          .m_combinationSize) {
                do {
                  local_5e0.
                  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                  .m_combination.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar13] =
                       local_5e0.
                       super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                       .m_combination.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar13 - 1] + 1;
                  uVar13 = uVar13 + 1;
                } while (uVar13 < (local_5e0.
                                   super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                                   ._16_8_ & 0xffffffff));
              }
              break;
            }
LAB_0048b812:
            uVar13 = uVar13 - 1;
            lVar17 = lVar17 + -0x100000000;
            lVar1 = uVar16 + 1 + lVar10;
            lVar10 = lVar10 + -1;
          } while (lVar1 != 1 && -1 < lVar1 + -1);
        }
      }
      local_5e0.
      super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
      .m_combinationIndex =
           local_5e0.
           super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
           .m_combinationIndex + 1;
      (*local_5e0.
        super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
        ._vptr_CombinationsIterator[2])
                (&local_580,&local_5e0,
                 &local_5e0.
                  super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
                  .m_combination);
      pvVar4 = local_578;
      pvVar3 = local_580;
      lVar10 = (long)local_578 - (long)local_580;
      uVar13 = lVar10 >> 2;
      if (0xaaaaaaaaaaaaaaa < uVar13) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      std::
      _Vector_base<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
      ::_Vector_base(&local_598,uVar13,__a);
      pAVar9 = local_598._M_impl.super__Vector_impl_data._M_start;
      if (pvVar4 == pvVar3) {
        local_598._M_impl.super__Vector_impl_data._M_finish =
             local_598._M_impl.super__Vector_impl_data._M_start;
        uVar13 = 0;
      }
      else {
        (local_598._M_impl.super__Vector_impl_data._M_start)->inputRate =
             VK_VERTEX_INPUT_RATE_VERTEX;
        (local_598._M_impl.super__Vector_impl_data._M_start)->glslType = GLSL_TYPE_INT;
        (local_598._M_impl.super__Vector_impl_data._M_start)->vkType = VK_FORMAT_UNDEFINED;
        if (lVar10 == 4) {
          local_598._M_impl.super__Vector_impl_data._M_finish =
               local_598._M_impl.super__Vector_impl_data._M_start + 1;
        }
        else {
          local_598._M_impl.super__Vector_impl_data._M_finish =
               local_598._M_impl.super__Vector_impl_data._M_start + uVar13;
          lVar10 = 0xc;
          do {
            *(VkVertexInputRate *)
             ((long)&(local_598._M_impl.super__Vector_impl_data._M_start)->inputRate + lVar10) =
                 (local_598._M_impl.super__Vector_impl_data._M_start)->inputRate;
            *(undefined8 *)
             ((long)&(local_598._M_impl.super__Vector_impl_data._M_start)->glslType + lVar10) =
                 *(undefined8 *)local_598._M_impl.super__Vector_impl_data._M_start;
            lVar10 = lVar10 + 0xc;
          } while (uVar13 * 0xc != lVar10);
        }
        pVVar15 = &(local_598._M_impl.super__Vector_impl_data._M_start)->inputRate;
        lVar10 = 0;
        do {
          uVar16 = (ulong)*(uint *)((long)local_580 + lVar10 * 4);
          dVar6 = deRandom_getUint32((deRandom *)&local_538.field_2);
          VVar2 = *(VkFormat *)
                   ((&lStack_2f0)[uVar16 * 4] +
                   ((ulong)dVar6 %
                   (ulong)((long)(local_2e8[uVar16 * 2]._M_allocated_capacity -
                                 (&lStack_2f0)[uVar16 * 4]) >> 2)) * 4);
          ((AttributeInfo *)(pVVar15 + -2))->glslType = *(GlslType *)((long)local_580 + lVar10 * 4);
          *pVVar15 = (VkVertexInputRate)lVar10 & VK_VERTEX_INPUT_RATE_INSTANCE;
          pVVar15[-1] = VVar2;
          lVar10 = lVar10 + 1;
          pVVar15 = pVVar15 + 3;
        } while (uVar13 + (uVar13 == 0) != lVar10);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
      if (pvVar4 != pvVar3) {
        uVar16 = 0;
        attributeInfo_04 = extraout_RDX;
        pAVar18 = pAVar9;
        do {
          (anonymous_namespace)::getAttributeInfoCaseName_abi_cxx11_
                    (&local_600,(_anonymous_namespace_ *)pAVar18,attributeInfo_04);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_470,local_600._M_dataplus._M_p,local_600._M_string_length);
          attributeInfo_04 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_600._M_dataplus._M_p != &local_600.field_2) {
            operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
            attributeInfo_04 = extraout_RDX_01;
          }
          if (uVar16 < uVar13 - 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,"-",1);
            attributeInfo_04 = extraout_RDX_02;
          }
          uVar16 = uVar16 + 1;
          pAVar18 = pAVar18 + 1;
        } while (uVar13 + (uVar13 == 0) != uVar16);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      std::ios_base::~ios_base(local_400);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_470);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_470,"Uses vertex attributes:\n",0x18);
      if (pvVar4 != pvVar3) {
        lVar10 = uVar13 + (uVar13 == 0);
        pAVar18 = pAVar9;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_470,"\t- ",3);
          (anonymous_namespace)::getAttributeInfoDescription_abi_cxx11_
                    (&local_600,(_anonymous_namespace_ *)pAVar18,attributeInfo_05);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_470,local_600._M_dataplus._M_p,
                               local_600._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_600._M_dataplus._M_p != &local_600.field_2) {
            operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
          }
          pAVar18 = pAVar18 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_470);
      std::ios_base::~ios_base(local_400);
      pVVar8 = (VertexInputTest *)operator_new(0x98);
      anon_unknown_0::VertexInputTest::VertexInputTest
                (pVVar8,testCtx,(string *)local_558.field_2._M_allocated_capacity,local_568,
                 (vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                  *)&local_598,BINDING_MAPPING_ONE_TO_ONE,ATTRIBUTE_LAYOUT_INTERLEAVED);
      tcu::TestNode::addChild(pTVar11,(TestNode *)pVVar8);
      pVVar8 = (VertexInputTest *)operator_new(0x98);
      anon_unknown_0::VertexInputTest::VertexInputTest
                (pVVar8,testCtx,(string *)local_558.field_2._M_allocated_capacity,local_568,
                 (vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                  *)&local_598,BINDING_MAPPING_ONE_TO_MANY,ATTRIBUTE_LAYOUT_INTERLEAVED);
      tcu::TestNode::addChild(this_00,(TestNode *)pVVar8);
      pVVar8 = (VertexInputTest *)operator_new(0x98);
      anon_unknown_0::VertexInputTest::VertexInputTest
                (pVVar8,testCtx,(string *)local_558.field_2._M_allocated_capacity,local_568,
                 (vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::AttributeInfo>_>
                  *)&local_598,BINDING_MAPPING_ONE_TO_MANY,ATTRIBUTE_LAYOUT_SEQUENTIAL);
      tcu::TestNode::addChild(this_01,(TestNode *)pVVar8);
      if (local_568 != &local_558) {
        operator_delete(local_568,(ulong)(local_558._M_dataplus._M_p + 1));
      }
      if ((string *)local_558.field_2._M_allocated_capacity != &local_538) {
        operator_delete((void *)local_558.field_2._M_allocated_capacity,
                        (ulong)(local_538._M_dataplus._M_p + 1));
      }
      if (pAVar9 != (pointer)0x0) {
        operator_delete(pAVar9,(long)local_598._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pAVar9);
      }
      if (local_580 != (void *)0x0) {
        operator_delete(local_580,local_570 - (long)local_580);
      }
    } while (local_5e0.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             .m_combinationIndex <
             local_5e0.
             super_CombinationsIterator<std::vector<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputTest::GlslType>_>_>
             .m_combinationCount);
  }
  this_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_02,testCtx,"binding_one_to_one",
             "Each attribute uses a unique binding");
  tcu::TestNode::addChild(this_02,pTVar11);
  tcu::TestNode::addChild(pTVar7,this_02);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,testCtx,"binding_one_to_many",
             "Attributes share the same binding");
  tcu::TestNode::addChild(pTVar11,this_00);
  tcu::TestNode::addChild(pTVar11,this_01);
  tcu::TestNode::addChild(pTVar7,pTVar11);
  anon_unknown_0::GlslTypeCombinationsIterator::~GlslTypeCombinationsIterator(&local_5e0);
  lVar10 = 0x2c0;
  do {
    pvVar3 = *(void **)((long)alStack_310 + lVar10);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)alStack_310 + lVar10 + 0x10) - (long)pvVar3);
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != 0);
  tcu::TestNode::addChild(this,pTVar7);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createVertexInputTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	vertexInputTests (new tcu::TestCaseGroup(testCtx, "vertex_input", ""));

	vertexInputTests->addChild(createSingleAttributeTests(testCtx).release());
	vertexInputTests->addChild(createMultipleAttributeTests(testCtx).release());

	return vertexInputTests.release();
}